

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O3

void __thiscall QWizardPage::QWizardPage(QWizardPage *this,QWidget *parent)

{
  QWidgetPrivate *this_00;
  long lVar1;
  long in_FS_OFFSET;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QWidgetPrivate *)operator_new(0x318);
  QWidgetPrivate::QWidgetPrivate(this_00,QObjectPrivateVersion);
  *(undefined ***)this_00 = &PTR__QWizardPagePrivate_00806478;
  *(undefined8 *)(this_00 + 1) = 0;
  *(undefined8 *)&this_00[1].field_0x8 = 0;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  *(undefined8 *)&this_00[1].field_0x20 = 0;
  *(undefined8 *)&this_00[1].field_0x28 = 0;
  *(undefined8 *)&this_00[1].field_0x30 = 0;
  lVar1 = 0x290;
  do {
    QPixmap::QPixmap((QPixmap *)(&this_00->super_QObjectPrivate + lVar1));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x2f0);
  this_00[1].layout = (QLayout *)0x0;
  this_00[1].needsFlush = (QRegion *)0x0;
  this_00[1].redirectDev = (QPaintDevice *)0x0;
  *(undefined4 *)&this_00[1].widgetItem = 0xffffffff;
  *(undefined2 *)((long)&this_00[1].widgetItem + 4) = 0;
  *(undefined1 *)((long)&this_00[1].widgetItem + 6) = 0;
  this_00[1].extraPaintEngine = (QPaintEngine *)0x0;
  QWidget::QWidget(&this->super_QWidget,this_00,parent,(WindowFlags)0x0);
  *(undefined ***)&this->super_QWidget = &PTR_metaObject_00805940;
  *(undefined ***)&(this->super_QWidget).super_QPaintDevice = &PTR__QWizardPage_00805b18;
  QObject::connect(local_30,(char *)this,(QObject *)"2completeChanged()",(char *)this,0x6e979d);
  QMetaObject::Connection::~Connection((Connection *)local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWizardPage::QWizardPage(QWidget *parent)
    : QWidget(*new QWizardPagePrivate, parent, { })
{
    connect(this, SIGNAL(completeChanged()), this, SLOT(_q_updateCachedCompleteState()));
}